

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_drbg.c
# Opt level: O0

int mbedtls_hmac_drbg_random(void *p_rng,uchar *output,size_t out_len)

{
  int iVar1;
  mbedtls_hmac_drbg_context *ctx;
  int ret;
  size_t out_len_local;
  uchar *output_local;
  void *p_rng_local;
  
  iVar1 = mbedtls_hmac_drbg_random_with_add(p_rng,output,out_len,(uchar *)0x0,0);
  return iVar1;
}

Assistant:

int mbedtls_hmac_drbg_random( void *p_rng, unsigned char *output, size_t out_len )
{
    int ret;
    mbedtls_hmac_drbg_context *ctx = (mbedtls_hmac_drbg_context *) p_rng;

#if defined(MBEDTLS_THREADING_C)
    if( ( ret = mbedtls_mutex_lock( &ctx->mutex ) ) != 0 )
        return( ret );
#endif

    ret = mbedtls_hmac_drbg_random_with_add( ctx, output, out_len, NULL, 0 );

#if defined(MBEDTLS_THREADING_C)
    if( mbedtls_mutex_unlock( &ctx->mutex ) != 0 )
        return( MBEDTLS_ERR_THREADING_MUTEX_ERROR );
#endif

    return( ret );
}